

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<notch::core::HingeLoss> __thiscall notch::core::MakeLayer::hinge(MakeLayer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  MakeLayer *in_RSI;
  shared_ptr<notch::core::HingeLoss> sVar2;
  allocator local_39;
  string local_38 [40];
  MakeLayer *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_local = this;
  if (in_RSI->nInputs == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"a HingeLoss",&local_39);
    logic_error(in_RSI,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::shared_ptr<notch::core::HingeLoss>::shared_ptr
              ((shared_ptr<notch::core::HingeLoss> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    sVar2 = std::make_shared<notch::core::HingeLoss>();
    _Var1 = sVar2.super___shared_ptr<notch::core::HingeLoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  }
  sVar2.super___shared_ptr<notch::core::HingeLoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::HingeLoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::HingeLoss>)
         sVar2.super___shared_ptr<notch::core::HingeLoss,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HingeLoss> hinge() {
        if (nInputs) {
            return std::make_shared<HingeLoss>();
        } else {
            logic_error("a HingeLoss");
            return nullptr; // unreachable
        }
     }